

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  MessageType MVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  cmake *pcVar9;
  uint uVar10;
  ulong uVar11;
  cmExecutionStatus status;
  MessageType messType;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  string err;
  cmListFileBacktrace bt;
  cmListFileContext conditionContext;
  cmConditionEvaluator conditionEvaluator;
  cmExecutionStatus local_1dc;
  cmMakefile *local_1d8;
  cmExecutionStatus *local_1d0;
  MessageType local_1c4;
  cmMakefile *local_1c0;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_1b8;
  string local_1a0;
  string *local_180;
  string local_178;
  cmListFileBacktrace local_158;
  cmListFileContext local_118;
  cmMakefile *local_d0;
  
  iVar6 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"if");
  if (iVar6 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
LAB_002a5291:
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
              (&this->Functions,lff);
  }
  else {
    iVar6 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endif")
    ;
    if (iVar6 != 0) goto LAB_002a5291;
    puVar1 = &this->ScopeDepth;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 != 0) goto LAB_002a5291;
    cmMakefile::RemoveFunctionBlocker
              ((cmMakefile *)&stack0xffffffffffffff30,(cmFunctionBlocker *)mf,
               (cmListFileFunction *)this);
    iVar6 = 0;
    if (local_d0 == (cmMakefile *)0x0) goto LAB_002a52a3;
    local_1c0 = local_d0;
    local_1dc.ReturnInvoked = false;
    local_1dc.BreakInvoked = false;
    local_1dc.ContinueInvoked = false;
    local_1dc.NestedError = false;
    local_180 = &(this->super_cmFunctionBlocker).StartingContext.FilePath;
    uVar10 = 0;
    local_1d8 = mf;
    local_1d0 = inStatus;
    while( true ) {
      uVar11 = (ulong)uVar10;
      pcVar2 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2 >> 6) <= uVar11)
      break;
      iVar7 = cmsys::SystemTools::Strucmp
                        (pcVar2[uVar11].super_cmCommandContext.Name._M_dataplus._M_p,"if");
      iVar8 = cmsys::SystemTools::Strucmp
                        ((this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].super_cmCommandContext.
                         Name._M_dataplus._M_p,"endif");
      iVar6 = (iVar6 + (uint)(iVar7 == 0)) - (uint)(iVar8 == 0);
      if (iVar6 == 0) {
        iVar7 = cmsys::SystemTools::Strucmp
                          ((this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar11].super_cmCommandContext.
                           Name._M_dataplus._M_p,"else");
        if (iVar7 == 0) {
          bVar5 = this->HasRun;
          this->IsBlocking = bVar5;
          this->HasRun = true;
          if (bVar5 == false) {
            pcVar9 = cmMakefile::GetCMakeInstance(local_1d8);
            if (pcVar9->Trace == true) {
              cmMakefile::PrintCommandTrace
                        (local_1d8,
                         (this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar11);
            }
          }
        }
        else {
          iVar7 = cmsys::SystemTools::Strucmp
                            ((this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar11].
                             super_cmCommandContext.Name._M_dataplus._M_p,"elseif");
          if (iVar7 != 0) goto LAB_002a5015;
          if (this->HasRun == true) {
            this->IsBlocking = true;
          }
          else {
            pcVar9 = cmMakefile::GetCMakeInstance(local_1d8);
            if (pcVar9->Trace == true) {
              cmMakefile::PrintCommandTrace
                        (local_1d8,
                         (this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar11);
            }
            pcVar3 = local_1d8;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            local_1a0._M_string_length = 0;
            local_1b8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1a0.field_2._M_local_buf[0] = '\0';
            local_1b8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1b8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmMakefile::ExpandArguments
                      (local_1d8,
                       &(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar11].Arguments,&local_1b8,
                       (char *)0x0);
            cmConditionEvaluator::GetConditionContext
                      (&local_118,pcVar3,
                       &(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar11].super_cmCommandContext,
                       local_180);
            cmMakefile::GetBacktrace
                      (&local_158,pcVar3,
                       &(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar11].super_cmCommandContext);
            cmConditionEvaluator::cmConditionEvaluator
                      ((cmConditionEvaluator *)&stack0xffffffffffffff30,pcVar3,&local_118,&local_158
                      );
            cmListFileBacktrace::~cmListFileBacktrace(&local_158);
            bVar5 = cmConditionEvaluator::IsTrue
                              ((cmConditionEvaluator *)&stack0xffffffffffffff30,&local_1b8,
                               &local_1a0,&local_1c4);
            if (local_1a0._M_string_length != 0) {
              cmIfCommandError_abi_cxx11_(&local_178,&local_1b8);
              std::__cxx11::string::append((string *)&local_178);
              pcVar3 = local_1d8;
              cmMakefile::GetBacktrace
                        (&local_158,local_1d8,
                         &(this->Functions).
                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11].super_cmCommandContext);
              pcVar9 = cmMakefile::GetCMakeInstance(pcVar3);
              MVar4 = local_1c4;
              cmake::IssueMessage(pcVar9,local_1c4,&local_178,&local_158,false);
              if (MVar4 == FATAL_ERROR) {
                cmSystemTools::s_FatalErrorOccured = true;
                cmListFileBacktrace::~cmListFileBacktrace(&local_158);
                std::__cxx11::string::~string((string *)&local_178);
                cmConditionEvaluator::~cmConditionEvaluator
                          ((cmConditionEvaluator *)&stack0xffffffffffffff30);
                cmListFileContext::~cmListFileContext(&local_118);
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                ~vector(&local_1b8);
                std::__cxx11::string::~string((string *)&local_1a0);
                break;
              }
              cmListFileBacktrace::~cmListFileBacktrace(&local_158);
              std::__cxx11::string::~string((string *)&local_178);
            }
            if (bVar5) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
            cmConditionEvaluator::~cmConditionEvaluator
                      ((cmConditionEvaluator *)&stack0xffffffffffffff30);
            cmListFileContext::~cmListFileContext(&local_118);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&local_1b8);
            std::__cxx11::string::~string((string *)&local_1a0);
          }
        }
      }
      else {
LAB_002a5015:
        if (this->IsBlocking == false) {
          local_1dc.ReturnInvoked = false;
          local_1dc.BreakInvoked = false;
          local_1dc.ContinueInvoked = false;
          local_1dc.NestedError = false;
          cmMakefile::ExecuteCommand
                    (local_1d8,
                     (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11,&local_1dc);
          if (local_1dc.ReturnInvoked == true) {
            local_1d0->ReturnInvoked = true;
            break;
          }
          if (local_1dc.BreakInvoked == true) {
            local_1d0->BreakInvoked = true;
            break;
          }
          if (local_1dc.ContinueInvoked == true) {
            local_1d0->ContinueInvoked = true;
            break;
          }
        }
      }
      uVar10 = uVar10 + 1;
    }
    (**(code **)(*(long *)&(local_1c0->CMP0054ReportedIds)._M_t._M_impl + 0x18))();
  }
  iVar6 = 1;
LAB_002a52a3:
  return SUB41(iVar6,0);
}

Assistant:

bool cmIfFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff,
                  cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"if"))
    {
    this->ScopeDepth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endif"))
    {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for(unsigned int c = 0; c < this->Functions.size(); ++c)
        {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"if"))
          {
          scopeDepth++;
          }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"endif"))
          {
          scopeDepth--;
          }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"else"))
          {
          this->IsBlocking = this->HasRun;
          this->HasRun = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if(!this->IsBlocking && mf.GetCMakeInstance()->GetTrace())
            {
            mf.PrintCommandTrace(this->Functions[c]);
            }
          }
        else if (scopeDepth == 0 && !cmSystemTools::Strucmp
                 (this->Functions[c].Name.c_str(),"elseif"))
          {
          if (this->HasRun)
            {
            this->IsBlocking = true;
            }
          else
            {
            // if trace is enabled, print the evaluated "elseif" statement
            if(mf.GetCMakeInstance()->GetTrace())
              {
              mf.PrintCommandTrace(this->Functions[c]);
              }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmListFileContext conditionContext =
                cmConditionEvaluator::GetConditionContext(
                  &mf, this->Functions[c],
                  this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(
                  mf, conditionContext,
                  mf.GetBacktrace(this->Functions[c]));

            bool isTrue = conditionEvaluator.IsTrue(
              expandedArguments, errorString, messType);

            if (!errorString.empty())
              {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR)
                {
                cmSystemTools::SetFatalErrorOccured();
                return true;
                }
              }

            if (isTrue)
              {
              this->IsBlocking = false;
              this->HasRun = true;
              }
            }
          }

        // should we execute?
        else if (!this->IsBlocking)
          {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            inStatus.SetBreakInvoked(true);
            return true;
            }
          if (status.GetContinueInvoked())
            {
            inStatus.SetContinueInvoked(true);
            return true;
            }
          }
        }
      return true;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}